

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPUtils.cpp
# Opt level: O2

bool net_uv::kcp_grab_syn_and_ack_value(char *data,uint32_t len,uint32_t *pValue,uint32_t *pConv)

{
  uint32_t uVar1;
  long lVar2;
  long lVar3;
  char *in_R8;
  bool bVar4;
  string str;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  if (pValue != (uint32_t *)0x0) {
    *pValue = 0;
  }
  if (pConv != (uint32_t *)0x0) {
    *pConv = 0;
  }
  get_kcp_packet_info_abi_cxx11_(&local_68,(net_uv *)data,(char *)(ulong)len,0x16028a,in_R8);
  if (local_68._M_string_length == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    lVar2 = std::__cxx11::string::find((char *)&local_68,0x16029e);
    lVar3 = std::__cxx11::string::find((char *)&local_68,0x1602a6);
    if (7 < lVar3 + 1U && lVar2 != -1) {
      if (pValue != (uint32_t *)0x0) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,local_68._M_dataplus._M_p + 7,
                   local_68._M_dataplus._M_p + lVar3);
        uVar1 = a2l_safe(&local_48);
        *pValue = uVar1;
        std::__cxx11::string::~string((string *)&local_48);
      }
      bVar4 = true;
      if (pConv != (uint32_t *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,local_68._M_dataplus._M_p + lVar3 + 6,&local_69);
        uVar1 = a2l_safe(&local_48);
        *pConv = uVar1;
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_68);
  return bVar4;
}

Assistant:

bool kcp_grab_syn_and_ack_value(const char* data, uint32_t len, uint32_t* pValue, uint32_t* pConv)
{
	if (pValue) *pValue = 0;
	if (pConv) *pConv = 0;

	std::string str = get_kcp_packet_info(data, len, NET_KCP_SYN_AND_ACK_PACKET);
	if (str.empty())
	{
		return false;
	}

	static const char* valueKey = " value:";
	static const char* convKey = " conv:";

	uint32_t valueKeyLen = strlen(valueKey);
	uint32_t convKeyLen = strlen(convKey);

	auto valuePos = str.find(valueKey);
	auto convPos = str.find(convKey);

	if (valuePos == std::string::npos || convPos == std::string::npos || convPos < valueKeyLen)
	{
		return false;
	}

	if (pValue) *pValue = a2l_safe(std::string(str.c_str() + valueKeyLen, convPos - valueKeyLen));
	if (pConv) *pConv = a2l_safe(std::string(str.c_str() + convPos + convKeyLen));

	return true;
}